

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O1

int slu_mmdelm_(int_t *mdnode,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *tag)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int_t iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  
  marker[(long)*mdnode + -1] = *tag;
  iVar5 = xadj[(long)*mdnode + -1];
  iVar6 = xadj[*mdnode];
  uVar11 = 0;
  iVar3 = iVar6 - iVar5;
  if (iVar5 < iVar6) {
    lVar8 = (long)iVar5;
    lVar10 = 0;
    uVar11 = 0;
    do {
      uVar1 = adjncy[lVar8 + lVar10 + -1];
      lVar9 = (long)(int)uVar1;
      if (lVar9 == 0) break;
      if (marker[lVar9 + -1] < *tag) {
        marker[lVar9 + -1] = *tag;
        if (dforw[lVar9 + -1] < 0) {
          llist[lVar9 + -1] = uVar11;
          uVar11 = uVar1;
        }
        else {
          adjncy[(long)iVar5 + -1] = uVar1;
          iVar5 = iVar5 + 1;
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar3 != (int)lVar10);
  }
  iVar6 = iVar6 + -1;
  for (; 0 < (int)uVar11; uVar11 = llist[(ulong)uVar11 - 1]) {
    adjncy[(long)iVar6 + -1] = -uVar11;
    iVar3 = xadj[uVar11];
    iVar7 = xadj[(ulong)uVar11 - 1];
    while (iVar7 < iVar3) {
      lVar8 = (long)iVar7;
      while( true ) {
        iVar4 = adjncy[lVar8 + -1];
        lVar10 = (long)iVar4;
        if (lVar10 < 0) break;
        if (iVar4 == 0) goto LAB_0010e381;
        if ((marker[lVar10 + -1] < *tag) && (-1 < dforw[lVar10 + -1])) {
          marker[lVar10 + -1] = *tag;
          for (; iVar6 <= iVar5; iVar6 = xadj[(long)(1 - adjncy[(long)iVar6 + -1]) + -1] + -1) {
            iVar5 = xadj[-1 - (long)adjncy[(long)iVar6 + -1]];
          }
          adjncy[(long)iVar5 + -1] = iVar4;
          iVar5 = iVar5 + 1;
        }
        lVar8 = lVar8 + 1;
        if (iVar3 <= lVar8) goto LAB_0010e381;
      }
      iVar3 = xadj[(uint)-iVar4];
      iVar7 = xadj[(ulong)(uint)-iVar4 - 1];
    }
LAB_0010e381:
  }
  if (iVar5 <= iVar6) {
    adjncy[(long)iVar5 + -1] = 0;
  }
  iVar5 = xadj[(long)*mdnode + -1];
  iVar6 = xadj[*mdnode];
  if (iVar5 < iVar6) {
    do {
      lVar8 = (long)iVar5;
      while( true ) {
        iVar3 = adjncy[lVar8 + -1];
        lVar10 = (long)iVar3;
        if (lVar10 < 0) break;
        if (iVar3 == 0) {
          return 0;
        }
        uVar11 = dbakw[lVar10 + -1];
        if (((ulong)uVar11 != 0) && (*maxint + uVar11 != 0)) {
          iVar5 = dforw[lVar10 + -1];
          if (0 < (long)iVar5) {
            dbakw[(long)iVar5 + -1] = uVar11;
          }
          if (0 < (int)uVar11) {
            dforw[(ulong)uVar11 - 1] = iVar5;
          }
          if ((int)uVar11 < 0) {
            dhead[(ulong)-uVar11 - 1] = iVar5;
          }
        }
        iVar5 = xadj[lVar10 + -1];
        iVar3 = xadj[lVar10];
        iVar4 = iVar5;
        if (iVar5 < iVar3) {
          lVar9 = 0;
          do {
            iVar2 = adjncy[(long)iVar5 + lVar9 + -1];
            if ((long)iVar2 == 0) break;
            if (marker[(long)iVar2 + -1] < *tag) {
              adjncy[(long)iVar4 + -1] = iVar2;
              iVar4 = iVar4 + 1;
            }
            lVar9 = lVar9 + 1;
          } while (iVar3 - iVar5 != (int)lVar9);
        }
        if (iVar4 - iVar5 == 0 || iVar4 < iVar5) {
          qsize[(long)*mdnode + -1] = qsize[(long)*mdnode + -1] + qsize[lVar10 + -1];
          qsize[lVar10 + -1] = 0;
          marker[lVar10 + -1] = *maxint;
          dforw[lVar10 + -1] = -*mdnode;
          dbakw[lVar10 + -1] = -*maxint;
        }
        else {
          dforw[lVar10 + -1] = (iVar4 - iVar5) + 1;
          dbakw[lVar10 + -1] = 0;
          adjncy[(long)iVar4 + -1] = *mdnode;
          if (iVar4 < iVar3 + -1) {
            adjncy[iVar4] = 0;
          }
        }
        lVar8 = lVar8 + 1;
        if (iVar6 <= lVar8) {
          return 0;
        }
      }
      iVar5 = xadj[(ulong)(uint)-iVar3 - 1];
      iVar6 = xadj[(uint)-iVar3];
    } while (iVar5 < iVar6);
  }
  return 0;
}

Assistant:

int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr, 
	istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */


/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L300;
	}
	if (marker[nabor] >= *tag) {
	    goto L200;
	}
	marker[nabor] = *tag;
	if (dforw[nabor] < 0) {
	    goto L100;
	}
	adjncy[rloc] = nabor;
	++rloc;
	goto L200;
L100:
	llist[nabor] = elmnt;
	elmnt = nabor;
L200:
	;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
	goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
	node = adjncy[j];
	link = -node;
	if (node < 0) {
	    goto L400;
	} else if (node == 0) {
	    goto L900;
	} else {
	    goto L500;
	}
L500:
	if (marker[node] >= *tag || dforw[node] < 0) {
	    goto L800;
	}
	marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
	if (rloc < rlmt) {
	    goto L700;
	}
	link = -adjncy[rlmt];
	rloc = xadj[link];
	rlmt = xadj[link + 1] - 1;
	goto L600;
L700:
	adjncy[rloc] = node;
	++rloc;
L800:
	;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
	adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	rnode = adjncy[i];
	link = -rnode;
	if (rnode < 0) {
	    goto L1100;
	} else if (rnode == 0) {
	    goto L1800;
	} else {
	    goto L1200;
	}
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
	pvnode = dbakw[rnode];
	if (pvnode == 0 || pvnode == -(*maxint)) {
	    goto L1300;
	}
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
	nxnode = dforw[rnode];
	if (nxnode > 0) {
	    dbakw[nxnode] = pvnode;
	}
	if (pvnode > 0) {
	    dforw[pvnode] = nxnode;
	}
	npv = -pvnode;
	if (pvnode < 0) {
	    dhead[npv] = nxnode;
	}
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
	jstrt = xadj[rnode];
	jstop = xadj[rnode + 1] - 1;
	xqnbr = jstrt;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    nabor = adjncy[j];
	    if (nabor == 0) {
		goto L1500;
	    }
	    if (marker[nabor] >= *tag) {
		goto L1400;
	    }
	    adjncy[xqnbr] = nabor;
	    ++xqnbr;
L1400:
	    ;
	}
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
	nqnbrs = xqnbr - jstrt;
	if (nqnbrs > 0) {
	    goto L1600;
	}
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
	qsize[*mdnode] += qsize[rnode];
	qsize[rnode] = 0;
	marker[rnode] = *maxint;
	dforw[rnode] = -(*mdnode);
	dbakw[rnode] = -(*maxint);
	goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
	dforw[rnode] = nqnbrs + 1;
	dbakw[rnode] = 0;
	adjncy[xqnbr] = *mdnode;
	++xqnbr;
	if (xqnbr <= jstop) {
	    adjncy[xqnbr] = 0;
	}

L1700:
	;
    }
L1800:
    return 0;

}